

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void temp_sync(TCGContext_conflict9 *s,TCGTemp *ts,TCGRegSet allocated_regs,TCGRegSet preferred_regs
              ,int free_or_dead)

{
  byte bVar1;
  int *piVar2;
  byte *pbVar3;
  tcg_insn_unit *ptVar4;
  byte bVar5;
  ulong uVar6;
  uint rm;
  ulong uVar7;
  int iVar8;
  uint r;
  int opc;
  TCGTemp *pTVar9;
  TCGContext_conflict9 *s_00;
  uint uVar10;
  undefined4 in_register_00000084;
  intptr_t iVar11;
  int in_R9D;
  
  iVar11 = CONCAT44(in_register_00000084,free_or_dead);
  uVar6 = *(ulong *)ts;
  if ((uVar6 >> 0x20 & 1) != 0) {
    return;
  }
  if ((uVar6 >> 0x23 & 1) != 0) goto LAB_00d0591c;
  pTVar9 = ts;
  s_00 = s;
  if ((uVar6 >> 0x24 & 1) == 0) {
    temp_allocate_frame(s,ts);
    uVar6 = *(ulong *)ts;
  }
  uVar10 = (uint)pTVar9;
  if ((char)(uVar6 >> 8) == '\x01') {
LAB_00d058f1:
    tcg_out_st(s,(TCGType_conflict)(uVar6 >> 0x18) & 0xff,(TCGReg)uVar6 & 0xff,
               (uint)*(byte *)ts->mem_base,ts->mem_offset);
  }
  else {
    rm = (uint)(uVar6 >> 8) & 0xff;
    if (rm != 2) {
      if (rm != 3) {
        temp_sync_cold_1();
        if (4 < uVar10) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                     ,0x459,(char *)0x0);
        }
        switch(uVar10) {
        case 0:
          uVar6 = 0;
          if (0 < (int)rm) {
            uVar6 = (ulong)rm;
          }
          uVar10 = (uint)uVar6;
          if (r < 0x10) {
            uVar10 = (uint)(uVar6 >> 3) & 1 | r >> 1 & 4;
            if (uVar10 != 0) {
              pbVar3 = s_00->code_ptr;
              s_00->code_ptr = pbVar3 + 1;
              *pbVar3 = (byte)uVar10 | 0x40;
            }
LAB_00d05a9b:
            ptVar4 = s_00->code_ptr;
            s_00->code_ptr = ptVar4 + 1;
            *ptVar4 = 0x8b;
            goto LAB_00d05aea;
          }
          iVar8 = 0x56e;
          break;
        case 1:
          if (r < 0x10) {
            uVar10 = 0;
            if (0 < (int)rm) {
              uVar10 = rm;
            }
            pbVar3 = s_00->code_ptr;
            s_00->code_ptr = pbVar3 + 1;
            *pbVar3 = (byte)(uVar10 >> 3) & 1 | (byte)(r >> 1) & 4 | 0x48;
            goto LAB_00d05a9b;
          }
        case 2:
          uVar10 = 0;
          if (0 < (int)rm) {
            uVar10 = rm;
          }
          iVar8 = 0x2017e;
          break;
        case 3:
          uVar10 = 0;
          if (0 < (int)rm) {
            uVar10 = rm;
          }
          iVar8 = 0x56f;
          break;
        case 4:
          uVar10 = 0;
          if (0 < (int)rm) {
            uVar10 = rm;
          }
          iVar8 = 0xa016f;
        }
        tcg_out_vex_opc(s_00,iVar8,r,0,uVar10,in_R9D);
LAB_00d05aea:
        tcg_out_sib_offset(s_00,r,rm,-1,0,iVar11);
        return;
      }
      bVar5 = (byte)(uVar6 >> 0x18);
      if (free_or_dead == 0) {
LAB_00d058d2:
        temp_load(s,ts,s->tcg_target_available_regs[bVar5],allocated_regs,preferred_regs);
        uVar6 = *(ulong *)ts;
        goto LAB_00d058f1;
      }
      bVar1 = *(byte *)ts->mem_base;
      iVar11 = ts->mem_offset;
      iVar8 = (int)ts->val;
      if (bVar5 == 0) {
        opc = 199;
      }
      else if ((bVar5 != 1) || (opc = 0x10c7, (long)iVar8 != ts->val)) goto LAB_00d058d2;
      tcg_out_opc(s,opc,0,(uint)bVar1,0);
      tcg_out_sib_offset(s,0,(uint)bVar1,-1,0,iVar11);
      piVar2 = (int *)s->code_ptr;
      *piVar2 = iVar8;
      s->code_ptr = (tcg_insn_unit *)(piVar2 + 1);
    }
  }
  uVar6 = *(ulong *)ts | 0x800000000;
  *(ulong *)ts = uVar6;
LAB_00d0591c:
  if ((uVar6 & 0x100000000) == 0 && free_or_dead != 0) {
    if (((uint)uVar6 & 0xff00) == 0x100) {
      s->reg_to_temp[uVar6 & 0xff] = (TCGTemp *)0x0;
      uVar6 = *(ulong *)ts;
    }
    uVar7 = uVar6 >> 0x1c & 0x200;
    if ((uVar6 >> 0x26 & 1) != 0) {
      uVar7 = 0x200;
    }
    if (free_or_dead < 0) {
      uVar7 = 0x200;
    }
    *(ulong *)ts = uVar6 & 0xffffffffffff00ff | uVar7;
  }
  return;
}

Assistant:

static void temp_sync(TCGContext *s, TCGTemp *ts, TCGRegSet allocated_regs,
                      TCGRegSet preferred_regs, int free_or_dead)
{
    if (ts->fixed_reg) {
        return;
    }
    if (!ts->mem_coherent) {
        if (!ts->mem_allocated) {
            temp_allocate_frame(s, ts);
        }
        switch (ts->val_type) {
        case TEMP_VAL_CONST:
            /* If we're going to free the temp immediately, then we won't
               require it later in a register, so attempt to store the
               constant to memory directly.  */
            if (free_or_dead
                && tcg_out_sti(s, ts->type, ts->val,
                               ts->mem_base->reg, ts->mem_offset)) {
                break;
            }
            temp_load(s, ts, s->tcg_target_available_regs[ts->type],
                      allocated_regs, preferred_regs);
            /* fallthrough */

        case TEMP_VAL_REG:
            tcg_out_st(s, ts->type, ts->reg,
                       ts->mem_base->reg, ts->mem_offset);
            break;

        case TEMP_VAL_MEM:
            break;

        case TEMP_VAL_DEAD:
        default:
            tcg_abort();
        }
        ts->mem_coherent = 1;
    }
    if (free_or_dead) {
        temp_free_or_dead(s, ts, free_or_dead);
    }
}